

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Token.cpp
# Opt level: O3

Token slang::parsing::Token::createMissing
                (BumpAllocator *alloc,TokenKind kind,SourceLocation location)

{
  ulong uVar1;
  Token *this;
  int iVar2;
  undefined6 in_register_00000032;
  Token TVar3;
  Token local_78;
  Token local_68;
  undefined8 local_58;
  char *pcStack_50;
  undefined8 local_48;
  char *pcStack_40;
  undefined8 local_38;
  char *pcStack_30;
  undefined8 local_28;
  char *pcStack_20;
  
  iVar2 = (int)CONCAT62(in_register_00000032,kind);
  if (0x157 < iVar2) {
    if ((iVar2 != 0x158) && (iVar2 != 0x15a)) {
      if (iVar2 != 0x159) goto switchD_001a44df_default;
      goto switchD_001a44df_caseD_4;
    }
    local_48 = 0;
    pcStack_40 = "";
    this = &local_78;
    Token(this,alloc,kind,(span<const_slang::parsing::Trivia,_18446744073709551615UL>)ZEXT816(0),
          (string_view)(ZEXT816(0x3f0621) << 0x40),location,Unknown);
    goto LAB_001a4754;
  }
  switch(iVar2) {
  case 4:
switchD_001a44df_caseD_4:
    local_28 = 0;
    pcStack_20 = "";
    local_38 = 0;
    pcStack_30 = "";
    this = &local_78;
    Token(this,alloc,kind,(span<const_slang::parsing::Trivia,_18446744073709551615UL>)ZEXT816(0),
          (string_view)(ZEXT816(0x3f0621) << 0x40),location,(string_view)(ZEXT816(0x3f0621) << 0x40)
         );
    break;
  case 5:
    local_58 = 0;
    pcStack_50 = "";
    this = &local_78;
    Token(this,alloc,IntegerLiteral,
          (span<const_slang::parsing::Trivia,_18446744073709551615UL>)ZEXT816(0),
          (string_view)(ZEXT816(0x3f0621) << 0x40),location,(SVInt *)SVInt::Zero);
    break;
  case 6:
    local_78.kind = Unknown;
    local_78._2_1_ = 0;
    local_78.numFlags.raw = '\0';
    local_78.rawLen = 0;
    local_78.info = (Info *)0x3f0621;
    this = &local_68;
    local_68._0_4_ = local_68._0_4_ & 0xffffff;
    local_68.rawLen = 0;
    local_68.info = (Info *)0x0;
    init(this,(EVP_PKEY_CTX *)alloc);
    local_68._0_4_ = local_68._0_4_ | 0x2000000;
    break;
  case 7:
    local_78.kind = Unknown;
    local_78._2_1_ = 0;
    local_78.numFlags.raw = '\0';
    local_78.rawLen = 0;
    local_78.info = (Info *)0x3f0621;
    local_68._0_4_ = local_68._0_4_ & 0xffffff;
    local_68.rawLen = 0;
    local_68.info = (Info *)0x0;
    init(&local_68,(EVP_PKEY_CTX *)alloc);
    *(undefined1 *)&local_68.info[1].rawTextPtr = 0x80;
    goto LAB_001a470c;
  case 8:
    goto LAB_001a46fa;
  case 9:
LAB_001a46fa:
    local_68.info = (Info *)0x0;
    local_68.rawLen = 0;
    local_68._0_4_ = local_68._0_4_ & 0xffffff;
    local_78.info = (Info *)0x3f0621;
    local_78.kind = Unknown;
    local_78._2_1_ = 0;
    local_78.numFlags.raw = '\0';
    local_78.rawLen = 0;
    init(&local_68,(EVP_PKEY_CTX *)alloc);
    local_68.info[1].rawTextPtr = (char *)0x0;
LAB_001a470c:
    uVar1 = CONCAT44(local_68.rawLen,local_68._0_4_);
    goto LAB_001a475b;
  default:
switchD_001a44df_default:
    local_78.kind = Unknown;
    local_78._2_1_ = 0;
    local_78.numFlags.raw = '\0';
    local_78.rawLen = 0;
    local_78.info = (Info *)0x3f0621;
    this = &local_68;
    local_68._0_4_ = local_68._0_4_ & 0xffffff;
    local_68.rawLen = 0;
    local_68.info = (Info *)0x0;
    init(this,(EVP_PKEY_CTX *)alloc);
  }
LAB_001a4754:
  uVar1._0_2_ = this->kind;
  uVar1._2_1_ = this->field_0x2;
  uVar1._3_1_ = this->numFlags;
  uVar1._4_4_ = this->rawLen;
  local_68.info = this->info;
LAB_001a475b:
  TVar3._0_8_ = uVar1 | 0x10000;
  TVar3.info = local_68.info;
  return TVar3;
}

Assistant:

Token Token::createMissing(BumpAllocator& alloc, TokenKind kind, SourceLocation location) {
    Token result;
    switch (kind) {
        case TokenKind::IncludeFileName:
        case TokenKind::StringLiteral:
            result = Token(alloc, kind, {}, "", location, "");
            break;
        case TokenKind::Directive:
        case TokenKind::MacroUsage:
            result = Token(alloc, kind, {}, "", location, SyntaxKind::Unknown);
            break;
        case TokenKind::IntegerLiteral:
            result = Token(alloc, kind, {}, "", location, SVInt::Zero);
            break;
        case TokenKind::IntegerBase:
            result = Token(alloc, kind, {}, "", location, LiteralBase::Decimal, false);
            break;
        case TokenKind::UnbasedUnsizedLiteral:
            result = Token(alloc, kind, {}, "", location, logic_t::x);
            break;
        case TokenKind::RealLiteral:
            result = Token(alloc, kind, {}, "", location, 0.0, false, std::nullopt);
            break;
        case TokenKind::TimeLiteral:
            result = Token(alloc, kind, {}, "", location, 0.0, false, TimeUnit::Seconds);
            break;
        default:
            result = Token(alloc, kind, {}, "", location);
            break;
    }

    result.missing = true;
    return result;
}